

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

char * Ptr_HopToType(Abc_Obj_t *pObj)

{
  Hop_Man_t *p;
  Hop_Obj_t *pObj_00;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x36,"char *Ptr_HopToType(Abc_Obj_t *)");
  }
  pAVar2 = Abc_ObjNtk(pObj);
  p = (Hop_Man_t *)pAVar2->pManFunc;
  pObj_00 = (Hop_Obj_t *)(pObj->field_5).pData;
  iVar1 = Abc_ObjFaninNum(pObj);
  Ptr_HopToType::uTruth = Hop_ManComputeTruth6(p,pObj_00,iVar1);
  if (Ptr_HopToType::uTruth == 0) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_1623fa;
  }
  else if (Ptr_HopToType::uTruth == 0xffffffffffffffff) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_162405;
  }
  else if (Ptr_HopToType::uTruth == Ptr_HopToType::uTruths6[0]) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_162410;
  }
  else if (Ptr_HopToType::uTruth == (Ptr_HopToType::uTruths6[0] ^ 0xffffffffffffffff)) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_16241b;
  }
  else if (Ptr_HopToType::uTruth == (Ptr_HopToType::uTruths6[0] & Ptr_HopToType::uTruths6[1])) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_162426;
  }
  else if (Ptr_HopToType::uTruth ==
           (Ptr_HopToType::uTruths6[0] & Ptr_HopToType::uTruths6[1] ^ 0xffffffffffffffff)) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_162431;
  }
  else if (Ptr_HopToType::uTruth == (Ptr_HopToType::uTruths6[0] | Ptr_HopToType::uTruths6[1])) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_16243c;
  }
  else if (Ptr_HopToType::uTruth ==
           ((Ptr_HopToType::uTruths6[0] | Ptr_HopToType::uTruths6[1]) ^ 0xffffffffffffffff)) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_162447;
  }
  else if (Ptr_HopToType::uTruth == (Ptr_HopToType::uTruths6[0] ^ Ptr_HopToType::uTruths6[1])) {
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_162452;
  }
  else {
    if (Ptr_HopToType::uTruth !=
        (Ptr_HopToType::uTruths6[0] ^ Ptr_HopToType::uTruths6[1] ^ 0xffffffffffffffff)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x4e,"char *Ptr_HopToType(Abc_Obj_t *)");
    }
    pObj_local = (Abc_Obj_t *)anon_var_dwarf_16245d;
  }
  return (char *)pObj_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Node type conversions.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Ptr_HopToType( Abc_Obj_t * pObj )
{
    static word uTruth, uTruths6[3] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
    };
    assert( Abc_ObjIsNode(pObj) );
    uTruth = Hop_ManComputeTruth6( (Hop_Man_t *)Abc_ObjNtk(pObj)->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj) );
/*
    if ( uTruth ==  0 )                           return "BAC_BOX_C0";
    if ( uTruth == ~(word)0 )                     return "BAC_BOX_C1";
    if ( uTruth ==  uTruths6[0] )                 return "BAC_BOX_BUF";
    if ( uTruth == ~uTruths6[0] )                 return "BAC_BOX_INV";
    if ( uTruth == (uTruths6[0] & uTruths6[1]) )  return "BAC_BOX_AND";
    if ( uTruth ==~(uTruths6[0] & uTruths6[1]) )  return "BAC_BOX_NAND";
    if ( uTruth == (uTruths6[0] | uTruths6[1]) )  return "BAC_BOX_OR";
    if ( uTruth ==~(uTruths6[0] | uTruths6[1]) )  return "BAC_BOX_NOR";
    if ( uTruth == (uTruths6[0] ^ uTruths6[1]) )  return "BAC_BOX_XOR";
    if ( uTruth ==~(uTruths6[0] ^ uTruths6[1]) )  return "BAC_BOX_XNOR";
*/
    if ( uTruth ==  0 )                           return "Const0T";
    if ( uTruth == ~(word)0 )                     return "Const1T";
    if ( uTruth ==  uTruths6[0] )                 return "BufT";
    if ( uTruth == ~uTruths6[0] )                 return "InvT";
    if ( uTruth == (uTruths6[0] & uTruths6[1]) )  return "AndT";
    if ( uTruth ==~(uTruths6[0] & uTruths6[1]) )  return "NandT";
    if ( uTruth == (uTruths6[0] | uTruths6[1]) )  return "OrT";
    if ( uTruth ==~(uTruths6[0] | uTruths6[1]) )  return "NorT";
    if ( uTruth == (uTruths6[0] ^ uTruths6[1]) )  return "XorT";
    if ( uTruth ==~(uTruths6[0] ^ uTruths6[1]) )  return "XnorT";
    assert( 0 );
    return NULL;
}